

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_assert.hpp
# Opt level: O2

void debug_assert::detail::
     debug_assertion_failed<type_safe::detail::precondition_error_handler,char_const(&)[37]>
               (source_location *loc,char *expression,char (*args) [37])

{
  default_handler::handle(loc,expression,*args);
  abort();
}

Assistant:

regular_void debug_assertion_failed(const source_location& loc, const char* expression,
                                        Args&&... args)
    {
#if defined(_MSC_VER)
#    pragma warning(push)
#    pragma warning(disable : 4702)
#endif
        return Handler::handle(loc, expression, detail::forward<Args>(args)...), std::abort(),
               regular_void();
#if defined(_MSC_VER)
#    pragma warning(pop)
#endif
    }